

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::RenderPassVkImpl::CreateRenderPass<1ul>(RenderPassVkImpl *this)

{
  VkBool32 VVar1;
  Uint32 UVar2;
  VulkanLogicalDevice *this_00;
  RenderPassAttachmentDesc *pRVar3;
  SubpassDependencyDesc *pSVar4;
  pointer pVVar5;
  pointer pVVar6;
  pointer pVVar7;
  pointer pVVar8;
  bool bVar9;
  VkFormat VVar10;
  VkAttachmentLoadOp VVar11;
  VkAttachmentStoreOp VVar12;
  VkImageLayout VVar13;
  VkPipelineStageFlags VVar14;
  VkAccessFlags VVar15;
  ulong uVar16;
  pointer pRVar17;
  value_type *pvVar18;
  VkAttachmentReference2 *pVVar19;
  Uint32 prsv_attachment;
  char *Args_1;
  char (*Args_1_00) [60];
  uint uVar20;
  Uint32 i_1;
  uint uVar21;
  SubpassDesc *pSVar22;
  ShadingRateAttachment *pSVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  Uint32 i;
  ulong uVar27;
  Uint32 i_2;
  long lVar28;
  ShadingRateAttachment *SRAttachment;
  long lVar29;
  ulong uVar30;
  bool FragDensityMapInsteadOfShadingRate;
  bool FragDensityMapEnabled;
  ShadingRateAttachment *local_190;
  vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_> vkDependencies;
  uint local_160;
  Uint32 CurrAttachmentReferenceInd;
  string msg;
  vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_> AttachmentStates;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vkPreserveAttachments;
  vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> vkAttachmentReferences;
  VkRenderPassCreateInfo local_d8;
  vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_> vkSubpasses;
  vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_> vkAttachments;
  anon_class_8_1_031e07a3 UpdateAttachmentsStates;
  vector<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
  vkShadingRate;
  
  this_00 = (((this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
             .m_pDevice)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  FragDensityMapInsteadOfShadingRate =
       (this_00->m_EnabledExtFeatures).FragmentDensityMap.fragmentDensityMap != 0;
  VVar1 = (this_00->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate;
  local_d8.pNext = (string *)0x0;
  local_d8.pAttachments = (VkAttachmentDescription *)0x0;
  local_d8.dependencyCount = 0;
  local_d8._52_4_ = 0;
  local_d8.pDependencies = (VkSubpassDependency *)0x0;
  local_d8.subpassCount = 0;
  local_d8._36_4_ = 0;
  local_d8.pSubpasses = (VkSubpassDescription *)0x0;
  local_d8.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_d8._4_4_ = 0;
  local_d8.flags = 0;
  local_d8.attachmentCount = 0;
  std::vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>::vector
            (&vkAttachments,
             (ulong)(this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                    .m_Desc.AttachmentCount,(allocator_type *)&vkDependencies);
  lVar28 = 0x20;
  lVar29 = 0;
  for (uVar27 = 0;
      pVVar8 = vkAttachments.
               super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar20 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
               .m_Desc.AttachmentCount, uVar27 < uVar20; uVar27 = uVar27 + 1) {
    pRVar3 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
             .m_Desc.pAttachments;
    *(undefined4 *)
     ((long)vkAttachments.
            super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>.
            _M_impl.super__Vector_impl_data._M_start + lVar28 + -0x20) = 0;
    VVar10 = TexFormatToVkFormat(*(TEXTURE_FORMAT *)((long)&pRVar3->Format + lVar29));
    *(VkFormat *)((long)pVVar8 + lVar28 + -0x1c) = VVar10;
    *(uint *)((long)pVVar8 + lVar28 + -0x18) = (uint)(&pRVar3->SampleCount)[lVar29];
    VVar11 = AttachmentLoadOpToVkAttachmentLoadOp((&pRVar3->LoadOp)[lVar29]);
    *(VkAttachmentLoadOp *)((long)pVVar8 + lVar28 + -0x14) = VVar11;
    VVar12 = AttachmentStoreOpToVkAttachmentStoreOp((&pRVar3->StoreOp)[lVar29]);
    *(VkAttachmentStoreOp *)((long)pVVar8 + lVar28 + -0x10) = VVar12;
    VVar11 = AttachmentLoadOpToVkAttachmentLoadOp((&pRVar3->StencilLoadOp)[lVar29]);
    *(VkAttachmentLoadOp *)((long)pVVar8 + lVar28 + -0xc) = VVar11;
    VVar12 = AttachmentStoreOpToVkAttachmentStoreOp((&pRVar3->StencilStoreOp)[lVar29]);
    *(VkAttachmentStoreOp *)((long)pVVar8 + lVar28 + -8) = VVar12;
    VVar13 = ResourceStateToVkImageLayout
                       (*(RESOURCE_STATE *)((long)&pRVar3->InitialState + lVar29),false,
                        FragDensityMapInsteadOfShadingRate);
    *(VkImageLayout *)((long)pVVar8 + lVar28 + -4) = VVar13;
    VVar13 = ResourceStateToVkImageLayout
                       (*(RESOURCE_STATE *)((long)&pRVar3->FinalState + lVar29),true,
                        FragDensityMapInsteadOfShadingRate);
    *(VkImageLayout *)((long)&pVVar8->flags + lVar28) = VVar13;
    lVar29 = lVar29 + 0x10;
    lVar28 = lVar28 + 0x24;
  }
  local_d8.attachmentCount = uVar20;
  local_d8.pAttachments =
       vkAttachments.
       super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>._M_impl
       .super__Vector_impl_data._M_start;
  pSVar22 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
            .m_Desc.pSubpasses;
  uVar20 = 0;
  uVar21 = 0;
  uVar26 = 0;
  for (lVar28 = 0;
      (ulong)(this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
             .m_Desc.SubpassCount * 0x48 - lVar28 != 0; lVar28 = lVar28 + 0x48) {
    iVar25 = *(int *)((long)&pSVar22->RenderTargetAttachmentCount + lVar28);
    iVar24 = uVar26 + *(int *)((long)&pSVar22->InputAttachmentCount + lVar28) + iVar25;
    if (*(long *)((long)&pSVar22->pResolveAttachments + lVar28) == 0) {
      iVar25 = 0;
    }
    uVar26 = (iVar25 + iVar24 + 1) -
             (uint)(*(long *)((long)&pSVar22->pDepthStencilAttachment + lVar28) == 0);
    uVar20 = uVar20 + (*(long *)((long)&pSVar22->pShadingRateAttachment + lVar28) != 0 && VVar1 != 0
                      );
    uVar21 = uVar21 + *(int *)((long)&pSVar22->PreserveAttachmentCount + lVar28);
  }
  std::vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>::vector
            (&vkAttachmentReferences,(ulong)uVar26 + (ulong)uVar20,(allocator_type *)&vkDependencies
            );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&vkPreserveAttachments,(ulong)uVar21,(allocator_type *)&vkDependencies);
  std::
  vector<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
  ::vector(&vkShadingRate,(ulong)uVar20,(allocator_type *)&vkDependencies);
  CurrAttachmentReferenceInd = 0;
  std::vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>::vector
            (&AttachmentStates,
             (ulong)(this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                    .m_Desc.AttachmentCount,(allocator_type *)&vkDependencies);
  std::vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>::vector
            (&vkSubpasses,
             (ulong)(this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                    .m_Desc.SubpassCount,(allocator_type *)&vkDependencies);
  uVar27 = 0;
  uVar20 = 0;
  local_160 = 0;
  local_190 = (ShadingRateAttachment *)0x0;
  while( true ) {
    pVVar7 = vkSubpasses.
             super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar16 = (ulong)(this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                    .m_Desc.SubpassCount;
    uVar30 = (ulong)local_160;
    if (uVar16 <= uVar27) break;
    pSVar22 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
              .m_Desc.pSubpasses;
    vkSubpasses.super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar27].flags = 0;
    vkSubpasses.super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar27].pipelineBindPoint =
         VK_PIPELINE_BIND_POINT_GRAPHICS;
    for (pRVar17 = AttachmentStates.
                   super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pRVar17 !=
        AttachmentStates.
        super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>.
        _M_impl.super__Vector_impl_data._M_finish; pRVar17 = pRVar17 + 1) {
      *pRVar17 = RESOURCE_STATE_UNKNOWN;
    }
    UpdateAttachmentsStates.AttachmentStates = &AttachmentStates;
    Args_1 = (char *)AttachmentStates.
                     super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
    CreateRenderPass<1UL>::anon_class_8_1_031e07a3::operator()
              (&UpdateAttachmentsStates,pSVar22[uVar27].InputAttachmentCount,
               pSVar22[uVar27].pInputAttachments);
    pSVar22 = pSVar22 + uVar27;
    CreateRenderPass<1UL>::anon_class_8_1_031e07a3::operator()
              (&UpdateAttachmentsStates,pSVar22->RenderTargetAttachmentCount,
               pSVar22->pRenderTargetAttachments);
    CreateRenderPass<1UL>::anon_class_8_1_031e07a3::operator()
              (&UpdateAttachmentsStates,1,pSVar22->pDepthStencilAttachment);
    vkDependencies.super__Vector_base<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&vkAttachmentReferences;
    vkDependencies.super__Vector_base<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)&CurrAttachmentReferenceInd;
    vkDependencies.super__Vector_base<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&AttachmentStates;
    UVar2 = pSVar22->InputAttachmentCount;
    pVVar7[uVar27].inputAttachmentCount = UVar2;
    if (UVar2 != 0) {
      Args_1 = (char *)0x1;
      pvVar18 = CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                          ((anon_class_32_4_53ae7d20 *)&vkDependencies,UVar2,
                           pSVar22->pInputAttachments,1);
      pVVar7[uVar27].pInputAttachments = pvVar18;
    }
    UVar2 = pSVar22->RenderTargetAttachmentCount;
    pVVar7[uVar27].colorAttachmentCount = UVar2;
    if (UVar2 != 0) {
      Args_1 = (char *)0x1;
      pvVar18 = CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                          ((anon_class_32_4_53ae7d20 *)&vkDependencies,UVar2,
                           pSVar22->pRenderTargetAttachments,1);
      pVVar7[uVar27].pColorAttachments = pvVar18;
      if (pSVar22->pResolveAttachments != (AttachmentReference *)0x0) {
        Args_1 = (char *)0x1;
        pvVar18 = CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                            ((anon_class_32_4_53ae7d20 *)&vkDependencies,
                             pSVar22->RenderTargetAttachmentCount,pSVar22->pResolveAttachments,1);
        pVVar7[uVar27].pResolveAttachments = pvVar18;
      }
    }
    if (pSVar22->pDepthStencilAttachment != (AttachmentReference *)0x0) {
      Args_1 = (char *)0x6;
      pvVar18 = CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                          ((anon_class_32_4_53ae7d20 *)&vkDependencies,1,
                           pSVar22->pDepthStencilAttachment,6);
      pVVar7[uVar27].pDepthStencilAttachment = pvVar18;
    }
    pVVar5 = vkShadingRate.
             super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar21 = pSVar22->PreserveAttachmentCount;
    pVVar7[uVar27].preserveAttachmentCount = uVar21;
    if (uVar21 != 0) {
      pVVar7[uVar27].pPreserveAttachments =
           vkPreserveAttachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar30;
      for (Args_1 = (char *)0x0; Args_1 < (char (*) [22])(ulong)uVar21; Args_1 = Args_1 + 1) {
        vkPreserveAttachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start[(ulong)(Args_1 + uVar30) & 0xffffffff] =
             pSVar22->pPreserveAttachments[(long)Args_1];
        uVar21 = pSVar22->PreserveAttachmentCount;
      }
      local_160 = local_160 + (int)Args_1;
    }
    pSVar23 = pSVar22->pShadingRateAttachment;
    if (pSVar23 != (ShadingRateAttachment *)0x0) {
      if (VVar1 == 0) {
        if (!FragDensityMapInsteadOfShadingRate) {
          FormatString<char[26],char[22]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"FragDensityMapEnabled",(char (*) [22])Args_1);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CreateRenderPass",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
                     ,0x11b);
          std::__cxx11::string::~string((string *)&msg);
        }
        if (local_190 == (ShadingRateAttachment *)0x0) {
          local_190 = pSVar22->pShadingRateAttachment;
        }
      }
      else {
        vkShadingRate.
        super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar20].pNext = (void *)0x0;
        vkShadingRate.
        super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar20].sType =
             VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR;
        pVVar19 = (VkAttachmentReference2 *)
                  CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                            ((anon_class_32_4_53ae7d20 *)&vkDependencies,1,&pSVar23->Attachment,1);
        pVVar5[uVar20].pFragmentShadingRateAttachment = pVVar19;
        UVar2 = pSVar23->TileSize[1];
        pVVar5 = pVVar5 + uVar20;
        (pVVar5->shadingRateAttachmentTexelSize).width = pSVar23->TileSize[0];
        (pVVar5->shadingRateAttachmentTexelSize).height = UVar2;
        uVar20 = uVar20 + 1;
      }
    }
    uVar27 = uVar27 + 1;
  }
  if ((FragDensityMapInsteadOfShadingRate) && (local_190 != (ShadingRateAttachment *)0x0)) {
    lVar28 = 0x40;
    for (uVar27 = 0; uVar27 < uVar16; uVar27 = uVar27 + 1) {
      pSVar22 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                .m_Desc.pSubpasses;
      pSVar23 = *(ShadingRateAttachment **)((long)&pSVar22->InputAttachmentCount + lVar28);
      if (pSVar23 == (ShadingRateAttachment *)0x0) {
        LogError<true,char[107]>
                  (false,"CreateRenderPass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
                   ,0x128,(char (*) [107])
                          "Vk_EXT_fragment_density_map extension requires that shading rate attachment is specified for all subpasses"
                  );
        pSVar23 = *(ShadingRateAttachment **)((long)&pSVar22->InputAttachmentCount + lVar28);
      }
      bVar9 = ShadingRateAttachment::operator!=(local_190,pSVar23);
      if (bVar9) {
        LogError<true,char[106]>
                  (false,"CreateRenderPass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
                   ,299,(char (*) [106])
                        "Vk_EXT_fragment_density_map extension requires that shading rate attachment is the same for all subpasses"
                  );
      }
      uVar16 = (ulong)(this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                      .m_Desc.SubpassCount;
      lVar28 = lVar28 + 0x48;
    }
  }
  Args_1_00 = (char (*) [60])
              ((long)vkAttachmentReferences.
                     super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)vkAttachmentReferences.
                     super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (Args_1_00 != (char (*) [60])(ulong)CurrAttachmentReferenceInd) {
    FormatString<char[26],char[60]>
              ((string *)&vkDependencies,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrAttachmentReferenceInd == vkAttachmentReferences.size()",
               Args_1_00);
    Args_1_00 = (char (*) [60])0x12f;
    DebugAssertionFailed
              ((Char *)vkDependencies.
                       super__Vector_base<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>
                       ._M_impl.super__Vector_impl_data._M_start,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
               ,0x12f);
    std::__cxx11::string::~string((string *)&vkDependencies);
  }
  if ((long)vkPreserveAttachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)vkPreserveAttachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start >> 2 != uVar30) {
    FormatString<char[26],char[58]>
              ((string *)&vkDependencies,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrPreserveAttachmentInd == vkPreserveAttachments.size()",
               (char (*) [58])Args_1_00);
    DebugAssertionFailed
              ((Char *)vkDependencies.
                       super__Vector_base<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>
                       ._M_impl.super__Vector_impl_data._M_start,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
               ,0x130);
    std::__cxx11::string::~string((string *)&vkDependencies);
  }
  local_d8.subpassCount =
       (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
       .m_Desc.SubpassCount;
  local_d8.pSubpasses =
       vkSubpasses.super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>.
       _M_impl.super__Vector_impl_data._M_start;
  std::vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>::vector
            (&vkDependencies,
             (ulong)(this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                    .m_Desc.DependencyCount,(allocator_type *)&msg);
  lVar28 = 0x14;
  lVar29 = 0x18;
  for (uVar27 = 0;
      pVVar6 = vkDependencies.
               super__Vector_base<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>._M_impl
               .super__Vector_impl_data._M_start,
      uVar20 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
               .m_Desc.DependencyCount, uVar27 < uVar20; uVar27 = uVar27 + 1) {
    pSVar4 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
             .m_Desc.pDependencies;
    *(undefined8 *)
     ((long)vkDependencies.
            super__Vector_base<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>._M_impl.
            super__Vector_impl_data._M_start + lVar29 + -0x18) =
         *(undefined8 *)((long)pSVar4 + lVar28 + -0x14);
    VVar14 = PipelineStageFlagsToVkPipelineStageFlags
                       (*(PIPELINE_STAGE_FLAGS *)((long)pSVar4 + lVar28 + -0xc));
    *(VkPipelineStageFlags *)((long)pVVar6 + lVar29 + -0x10) = VVar14;
    VVar14 = PipelineStageFlagsToVkPipelineStageFlags
                       (*(PIPELINE_STAGE_FLAGS *)((long)pSVar4 + lVar28 + -8));
    *(VkPipelineStageFlags *)((long)pVVar6 + lVar29 + -0xc) = VVar14;
    VVar15 = AccessFlagsToVkAccessFlags(*(ACCESS_FLAGS *)((long)pSVar4 + lVar28 + -4));
    *(VkAccessFlags *)((long)pVVar6 + lVar29 + -8) = VVar15;
    VVar15 = AccessFlagsToVkAccessFlags(*(ACCESS_FLAGS *)((long)&pSVar4->SrcSubpass + lVar28));
    *(VkAccessFlags *)((long)pVVar6 + lVar29 + -4) = VVar15;
    *(undefined4 *)((long)&pVVar6->srcSubpass + lVar29) = 1;
    lVar28 = lVar28 + 0x18;
    lVar29 = lVar29 + 0x1c;
  }
  local_d8.dependencyCount = uVar20;
  local_d8.pDependencies =
       vkDependencies.super__Vector_base<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>.
       _M_impl.super__Vector_impl_data._M_start;
  msg.field_2._M_allocated_capacity = 0;
  msg._M_dataplus._M_p = (pointer)0x0;
  msg._M_string_length = 0;
  if ((FragDensityMapInsteadOfShadingRate) && (local_190 != (ShadingRateAttachment *)0x0)) {
    local_d8.pNext = &msg;
    msg._M_dataplus._M_p = (pointer)0x3b9e1d92;
    msg.field_2._M_allocated_capacity._4_4_ = 0x3b9e1d90;
    msg.field_2._M_allocated_capacity._0_4_ = (local_190->Attachment).AttachmentIndex;
  }
  VulkanUtilities::VulkanLogicalDevice::CreateRenderPass
            ((RenderPassWrapper *)&UpdateAttachmentsStates,this_00,&local_d8,
             (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8>::
  operator=(&this->m_VkRenderPass,
            (VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8> *)
            &UpdateAttachmentsStates);
  VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8> *)
             &UpdateAttachmentsStates);
  if ((this->m_VkRenderPass).m_VkObject == (VkRenderPass_T *)0x0) {
    LogError<true,char[36]>
              (false,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
               ,0x15c,(char (*) [36])"Failed to create Vulkan render pass");
  }
  std::_Vector_base<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>::~_Vector_base
            (&vkDependencies.
              super__Vector_base<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>);
  std::_Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>::~_Vector_base
            (&vkSubpasses.
              super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>);
  std::_Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>::
  ~_Vector_base(&AttachmentStates.
                 super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
               );
  std::
  _Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
  ::~_Vector_base(&vkShadingRate.
                   super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
                 );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vkPreserveAttachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
  ;
  std::_Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>::~_Vector_base
            (&vkAttachmentReferences.
              super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>);
  std::_Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>::
  ~_Vector_base(&vkAttachments.
                 super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>
               );
  return;
}

Assistant:

void RenderPassVkImpl::CreateRenderPass() noexcept(false)
{
    using RenderPassCIType          = std::conditional_t<RPVersion == 2, VkRenderPassCreateInfo2, VkRenderPassCreateInfo>;
    using SubpassDescriptionType    = std::conditional_t<RPVersion == 2, VkSubpassDescription2, VkSubpassDescription>;
    using AttachmentDescriptionType = std::conditional_t<RPVersion == 2, VkAttachmentDescription2, VkAttachmentDescription>;
    using AttachmentReferenceType   = std::conditional_t<RPVersion == 2, VkAttachmentReference2, VkAttachmentReference>;
    using SubpassDependencyType     = std::conditional_t<RPVersion == 2, VkSubpassDependency2, VkSubpassDependency>;

    const auto& LogicalDevice         = m_pDevice->GetLogicalDevice();
    const auto& ExtFeats              = LogicalDevice.GetEnabledExtFeatures();
    const bool  ShadingRateEnabled    = ExtFeats.ShadingRate.attachmentFragmentShadingRate != VK_FALSE;
    const bool  FragDensityMapEnabled = ExtFeats.FragmentDensityMap.fragmentDensityMap != VK_FALSE;

    RenderPassCIType RenderPassCI{};
    RenderPassCI.sType = RPVersion == 2 ? VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2 : VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
    RenderPassCI.pNext = nullptr;
    RenderPassCI.flags = 0;

    std::vector<AttachmentDescriptionType> vkAttachments(m_Desc.AttachmentCount);
    for (Uint32 i = 0; i < m_Desc.AttachmentCount; ++i)
    {
        const auto& Attachment   = m_Desc.pAttachments[i];
        auto&       vkAttachment = vkAttachments[i];

        InitAttachmentDescription(vkAttachment);
        vkAttachment.flags          = 0;
        vkAttachment.format         = TexFormatToVkFormat(Attachment.Format);
        vkAttachment.samples        = static_cast<VkSampleCountFlagBits>(Attachment.SampleCount);
        vkAttachment.loadOp         = AttachmentLoadOpToVkAttachmentLoadOp(Attachment.LoadOp);
        vkAttachment.storeOp        = AttachmentStoreOpToVkAttachmentStoreOp(Attachment.StoreOp);
        vkAttachment.stencilLoadOp  = AttachmentLoadOpToVkAttachmentLoadOp(Attachment.StencilLoadOp);
        vkAttachment.stencilStoreOp = AttachmentStoreOpToVkAttachmentStoreOp(Attachment.StencilStoreOp);
        vkAttachment.initialLayout  = ResourceStateToVkImageLayout(Attachment.InitialState, /*IsInsideRenderPass = */ false, FragDensityMapEnabled);
        vkAttachment.finalLayout    = ResourceStateToVkImageLayout(Attachment.FinalState, /*IsInsideRenderPass = */ true, FragDensityMapEnabled);
    }
    RenderPassCI.attachmentCount = m_Desc.AttachmentCount;
    RenderPassCI.pAttachments    = vkAttachments.data();

    Uint32 TotalAttachmentReferencesCount   = 0;
    Uint32 TotalPreserveAttachmentsCount    = 0;
    Uint32 TotalShadingRateAttachmentsCount = 0;
    for (Uint32 i = 0; i < m_Desc.SubpassCount; ++i)
    {
        const auto& Subpass = m_Desc.pSubpasses[i];
        TotalAttachmentReferencesCount += Subpass.InputAttachmentCount;
        TotalAttachmentReferencesCount += Subpass.RenderTargetAttachmentCount;
        if (Subpass.pResolveAttachments != nullptr)
            TotalAttachmentReferencesCount += Subpass.RenderTargetAttachmentCount;
        if (Subpass.pDepthStencilAttachment != nullptr)
            TotalAttachmentReferencesCount += 1;
        if (Subpass.pShadingRateAttachment != nullptr && ShadingRateEnabled)
            TotalShadingRateAttachmentsCount += 1;
        TotalPreserveAttachmentsCount += Subpass.PreserveAttachmentCount;
    }

    std::vector<AttachmentReferenceType>                vkAttachmentReferences(size_t{TotalAttachmentReferencesCount} + size_t{TotalShadingRateAttachmentsCount});
    std::vector<Uint32>                                 vkPreserveAttachments(TotalPreserveAttachmentsCount);
    std::vector<VkFragmentShadingRateAttachmentInfoKHR> vkShadingRate{TotalShadingRateAttachmentsCount};
    const ShadingRateAttachment*                        pMainSRA = nullptr;

    Uint32 CurrAttachmentReferenceInd = 0;
    Uint32 CurrPreserveAttachmentInd  = 0;

    // State flags for every attachment in each subpass.
    // This array is used to detect attachments that are used as render target or depth-stencil,
    // but also as input attachment in the same subpass. Such attachments need to use GENERAL layout.
    std::vector<RESOURCE_STATE> AttachmentStates(m_Desc.AttachmentCount);

    std::vector<SubpassDescriptionType> vkSubpasses(m_Desc.SubpassCount);
    for (Uint32 i = 0, SRInd = 0; i < m_Desc.SubpassCount; ++i)
    {
        const auto& SubpassDesc = m_Desc.pSubpasses[i];
        auto&       vkSubpass   = vkSubpasses[i];

        InitSubpassDescription(vkSubpass);
        vkSubpass.flags             = 0;
        vkSubpass.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;

        std::fill(AttachmentStates.begin(), AttachmentStates.end(), RESOURCE_STATE_UNKNOWN);
        auto UpdateAttachmentsStates = [&AttachmentStates](Uint32 NumAttachments, const AttachmentReference* pSrcAttachments) //
        {
            if (pSrcAttachments == nullptr)
                return;
            for (Uint32 attachment = 0; attachment < NumAttachments; ++attachment)
            {
                const auto& SrcAttachmentRef = pSrcAttachments[attachment];
                if (SrcAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                    AttachmentStates[SrcAttachmentRef.AttachmentIndex] |= SrcAttachmentRef.State;
            }
        };
        UpdateAttachmentsStates(SubpassDesc.InputAttachmentCount, SubpassDesc.pInputAttachments);
        UpdateAttachmentsStates(SubpassDesc.RenderTargetAttachmentCount, SubpassDesc.pRenderTargetAttachments);
        UpdateAttachmentsStates(1, SubpassDesc.pDepthStencilAttachment);

        auto ConvertAttachmentReferences = [&](Uint32 NumAttachments, const AttachmentReference* pSrcAttachments, VkImageAspectFlags AspectMask) //
        {
            auto* pCurrVkAttachmentReference = &vkAttachmentReferences[CurrAttachmentReferenceInd];
            for (Uint32 attachment = 0; attachment < NumAttachments; ++attachment, ++CurrAttachmentReferenceInd)
            {
                const auto& SrcAttachmentRef = pSrcAttachments[attachment];
                auto&       DstAttachmentRef = vkAttachmentReferences[CurrAttachmentReferenceInd];

                InitAttachmentReference(DstAttachmentRef, AspectMask);
                DstAttachmentRef.attachment = SrcAttachmentRef.AttachmentIndex;

                auto State = SrcAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED ?
                    AttachmentStates[SrcAttachmentRef.AttachmentIndex] :
                    SrcAttachmentRef.State;
                if (PlatformMisc::CountOneBits(State) >= 2)
                {
                    // The same attachment is used in different ways in this subpass (e.g. color and input attachments).
                    // It must use COMMON layout.
                    State = RESOURCE_STATE_COMMON;
                }
                else
                {
                    VERIFY_EXPR(State == RESOURCE_STATE_UNKNOWN || State == SrcAttachmentRef.State);
                    State = SrcAttachmentRef.State;
                }

                DstAttachmentRef.layout = ResourceStateToVkImageLayout(State, /*IsInsideRenderPass = */ true, FragDensityMapEnabled);
            }
            return pCurrVkAttachmentReference;
        };

        vkSubpass.inputAttachmentCount = SubpassDesc.InputAttachmentCount;
        if (SubpassDesc.InputAttachmentCount != 0)
        {
            vkSubpass.pInputAttachments = ConvertAttachmentReferences(SubpassDesc.InputAttachmentCount, SubpassDesc.pInputAttachments, VK_IMAGE_ASPECT_COLOR_BIT);
        }

        vkSubpass.colorAttachmentCount = SubpassDesc.RenderTargetAttachmentCount;
        if (SubpassDesc.RenderTargetAttachmentCount != 0)
        {
            vkSubpass.pColorAttachments = ConvertAttachmentReferences(SubpassDesc.RenderTargetAttachmentCount, SubpassDesc.pRenderTargetAttachments, VK_IMAGE_ASPECT_COLOR_BIT);
            if (SubpassDesc.pResolveAttachments != nullptr)
            {
                vkSubpass.pResolveAttachments = ConvertAttachmentReferences(SubpassDesc.RenderTargetAttachmentCount, SubpassDesc.pResolveAttachments, VK_IMAGE_ASPECT_COLOR_BIT);
            }
        }

        if (SubpassDesc.pDepthStencilAttachment != nullptr)
        {
            vkSubpass.pDepthStencilAttachment = ConvertAttachmentReferences(1, SubpassDesc.pDepthStencilAttachment, VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT);
        }

        vkSubpass.preserveAttachmentCount = SubpassDesc.PreserveAttachmentCount;
        if (SubpassDesc.PreserveAttachmentCount != 0)
        {
            vkSubpass.pPreserveAttachments = &vkPreserveAttachments[CurrPreserveAttachmentInd];
            for (Uint32 prsv_attachment = 0; prsv_attachment < SubpassDesc.PreserveAttachmentCount; ++prsv_attachment, ++CurrPreserveAttachmentInd)
            {
                vkPreserveAttachments[CurrPreserveAttachmentInd] = SubpassDesc.pPreserveAttachments[prsv_attachment];
            }
        }

        if (SubpassDesc.pShadingRateAttachment != nullptr)
        {
            if (ShadingRateEnabled)
            {
                const auto& SRAttachment   = *SubpassDesc.pShadingRateAttachment;
                auto&       vkSRAttachment = vkShadingRate[SRInd++];

                SetSubpassDescriptionNext(vkSubpass, &vkSRAttachment);
                vkSRAttachment.pNext                          = nullptr;
                vkSRAttachment.sType                          = VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR;
                vkSRAttachment.pFragmentShadingRateAttachment = reinterpret_cast<const VkAttachmentReference2*>(ConvertAttachmentReferences(1, &SRAttachment.Attachment, VK_IMAGE_ASPECT_COLOR_BIT));
                vkSRAttachment.shadingRateAttachmentTexelSize = {SRAttachment.TileSize[0], SRAttachment.TileSize[1]};
            }
            else
            {
                VERIFY_EXPR(FragDensityMapEnabled);
                pMainSRA = pMainSRA ? pMainSRA : SubpassDesc.pShadingRateAttachment;
            }
        }
    }

    if (FragDensityMapEnabled && pMainSRA != nullptr)
    {
        for (Uint32 i = 0; i < m_Desc.SubpassCount; ++i)
        {
            const auto& SubpassDesc = m_Desc.pSubpasses[i];

            if (SubpassDesc.pShadingRateAttachment == nullptr)
                LOG_ERROR_AND_THROW("Vk_EXT_fragment_density_map extension requires that shading rate attachment is specified for all subpasses");

            if (*pMainSRA != *SubpassDesc.pShadingRateAttachment)
                LOG_ERROR_AND_THROW("Vk_EXT_fragment_density_map extension requires that shading rate attachment is the same for all subpasses");
        }
    }

    VERIFY_EXPR(CurrAttachmentReferenceInd == vkAttachmentReferences.size());
    VERIFY_EXPR(CurrPreserveAttachmentInd == vkPreserveAttachments.size());
    RenderPassCI.subpassCount = m_Desc.SubpassCount;
    RenderPassCI.pSubpasses   = vkSubpasses.data();

    std::vector<SubpassDependencyType> vkDependencies(m_Desc.DependencyCount);
    for (Uint32 i = 0; i < m_Desc.DependencyCount; ++i)
    {
        const auto& DependencyDesc = m_Desc.pDependencies[i];
        auto&       vkDependency   = vkDependencies[i];

        InitSubpassDependency(vkDependency);
        vkDependency.srcSubpass    = DependencyDesc.SrcSubpass;
        vkDependency.dstSubpass    = DependencyDesc.DstSubpass;
        vkDependency.srcStageMask  = PipelineStageFlagsToVkPipelineStageFlags(DependencyDesc.SrcStageMask);
        vkDependency.dstStageMask  = PipelineStageFlagsToVkPipelineStageFlags(DependencyDesc.DstStageMask);
        vkDependency.srcAccessMask = AccessFlagsToVkAccessFlags(DependencyDesc.SrcAccessMask);
        vkDependency.dstAccessMask = AccessFlagsToVkAccessFlags(DependencyDesc.DstAccessMask);

        // VK_DEPENDENCY_BY_REGION_BIT specifies that dependencies will be framebuffer-local.
        // Framebuffer-local dependencies are more optimal for most architectures; particularly
        // tile-based architectures - which can keep framebuffer-regions entirely in on-chip registers
        // and thus avoid external bandwidth across such a dependency. Including a framebuffer-global
        // dependency in your rendering will usually force all implementations to flush data to memory,
        // or to a higher level cache, breaking any potential locality optimizations.
        vkDependency.dependencyFlags = VK_DEPENDENCY_BY_REGION_BIT;
    }
    RenderPassCI.dependencyCount = m_Desc.DependencyCount;
    RenderPassCI.pDependencies   = vkDependencies.data();

    // Enable fragment density map
    VkRenderPassFragmentDensityMapCreateInfoEXT FragDensityMapCI{};
    if (FragDensityMapEnabled && pMainSRA != nullptr)
    {
        RenderPassCI.pNext     = &FragDensityMapCI;
        FragDensityMapCI.sType = VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT;
        FragDensityMapCI.pNext = nullptr;

        FragDensityMapCI.fragmentDensityMapAttachment.attachment = pMainSRA->Attachment.AttachmentIndex;
        FragDensityMapCI.fragmentDensityMapAttachment.layout     = VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT;
    }

    m_VkRenderPass = LogicalDevice.CreateRenderPass(RenderPassCI, m_Desc.Name);
    if (!m_VkRenderPass)
    {
        LOG_ERROR_AND_THROW("Failed to create Vulkan render pass");
    }
}